

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          align_spec *spec,inf_or_nan_writer *f)

{
  byte bVar1;
  undefined2 uVar2;
  undefined8 *puVar3;
  long lVar4;
  char cVar5;
  size_t __len;
  size_t __n;
  char __tmp;
  ulong uVar6;
  basic_buffer<char> *c;
  size_t size;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  
  uVar8 = (ulong)spec->width_;
  cVar5 = f->sign;
  uVar6 = 4 - (ulong)(cVar5 == '\0');
  puVar3 = *(undefined8 **)this;
  lVar4 = puVar3[2];
  __n = uVar8 - uVar6;
  if (uVar8 < uVar6 || __n == 0) {
    uVar6 = uVar6 + lVar4;
    if ((ulong)puVar3[3] < uVar6) {
      (**(code **)*puVar3)(puVar3,uVar6);
      cVar5 = f->sign;
    }
    puVar3[2] = uVar6;
    pcVar7 = (char *)(lVar4 + puVar3[1]);
    if (cVar5 != '\0') {
      *pcVar7 = cVar5;
      pcVar7 = pcVar7 + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    pcVar7[2] = f->str[2];
    *(undefined2 *)pcVar7 = uVar2;
    return;
  }
  uVar8 = uVar8 + lVar4;
  if ((ulong)puVar3[3] < uVar8) {
    (**(code **)*puVar3)(puVar3,uVar8);
  }
  puVar3[2] = uVar8;
  pcVar7 = (char *)(lVar4 + puVar3[1]);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar6 = __n >> 1 & 0x7fffffff;
    if (1 < __n) {
      memset(pcVar7,(uint)bVar1,uVar6);
      pcVar7 = pcVar7 + uVar6;
    }
    if (f->sign != '\0') {
      *pcVar7 = f->sign;
      pcVar7 = pcVar7 + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    pcVar7[2] = f->str[2];
    *(undefined2 *)pcVar7 = uVar2;
    __n = __n - uVar6;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pcVar9 = pcVar7 + __n;
      memset(pcVar7,(uint)bVar1,__n);
      if (f->sign != '\0') {
        *pcVar9 = f->sign;
        pcVar9 = pcVar9 + 1;
      }
      uVar2 = *(undefined2 *)f->str;
      pcVar9[2] = f->str[2];
      *(undefined2 *)pcVar9 = uVar2;
      return;
    }
    if (f->sign != '\0') {
      *pcVar7 = f->sign;
      pcVar7 = pcVar7 + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    pcVar7[2] = f->str[2];
    *(undefined2 *)pcVar7 = uVar2;
  }
  memset(pcVar7 + 3,(uint)bVar1,__n);
  return;
}

Assistant:

FMT_CONSTEXPR unsigned width() const { return width_; }